

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

xmlChar * xmlParseEntityValue(xmlParserCtxtPtr ctxt,xmlChar **orig)

{
  byte bVar1;
  xmlParserInputPtr pxVar2;
  uint val;
  int iVar3;
  byte *str;
  byte *pbVar4;
  long lVar5;
  xmlChar *pxVar6;
  int iVar7;
  uint uVar8;
  xmlParserErrors error;
  int iVar9;
  int l;
  int local_54;
  byte *local_50;
  uint local_44;
  xmlParserInputPtr local_40;
  xmlChar **local_38;
  
  local_50 = (byte *)0x0;
  bVar1 = *ctxt->input->cur;
  uVar8 = (uint)bVar1;
  if (bVar1 != 0x22) {
    if (bVar1 != 0x27) {
      xmlFatalErr(ctxt,XML_ERR_ENTITY_NOT_STARTED,(char *)0x0);
      return (xmlChar *)0x0;
    }
    uVar8 = 0x27;
  }
  str = (byte *)(*xmlMallocAtomic)(100);
  if (str == (byte *)0x0) {
    xmlErrMemory(ctxt,(char *)0x0);
    return (xmlChar *)0x0;
  }
  ctxt->instate = XML_PARSER_ENTITY_VALUE;
  local_40 = ctxt->input;
  local_44 = uVar8;
  if ((ctxt->progressive == 0) && ((long)local_40->end - (long)local_40->cur < 0xfa)) {
    xmlGROW(ctxt);
  }
  pxVar6 = (xmlChar *)0x0;
  if (ctxt->instate != XML_PARSER_EOF) {
    local_38 = orig;
    xmlNextChar(ctxt);
    iVar9 = 100;
    iVar7 = 0;
    pbVar4 = str;
    uVar8 = local_44;
    do {
      val = xmlCurrentChar(ctxt,&local_54);
      str = pbVar4;
      do {
        if ((int)val < 0x100) {
          if ((0x1f < (int)val) || ((val < 0xe && ((0x2600U >> (val & 0x1f) & 1) != 0))))
          goto LAB_0015cc14;
LAB_0015cd62:
          str[iVar7] = 0;
          if (ctxt->instate == XML_PARSER_EOF) goto LAB_0015ce33;
          if (val != uVar8) {
            error = XML_ERR_ENTITY_NOT_FINISHED;
            goto LAB_0015ce0f;
          }
          xmlNextChar(ctxt);
          local_50 = str;
          goto LAB_0015cd98;
        }
        if ((0xfffff < val - 0x10000 && 0x1ffd < val - 0xe000) && 0xd7ff < (int)val)
        goto LAB_0015cd62;
LAB_0015cc14:
        if (((val == uVar8) && (ctxt->input == local_40)) || (ctxt->instate == XML_PARSER_EOF))
        goto LAB_0015cd62;
        pbVar4 = str;
        if (iVar9 <= iVar7 + 5) {
          iVar9 = iVar9 * 2;
          pbVar4 = (byte *)(*xmlRealloc)(str,(long)iVar9);
          uVar8 = local_44;
          if (pbVar4 == (byte *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            goto LAB_0015ce33;
          }
        }
        if (local_54 == 1) {
          lVar5 = (long)iVar7;
          iVar7 = iVar7 + 1;
          pbVar4[lVar5] = (byte)val;
        }
        else {
          iVar3 = xmlCopyCharMultiByte(pbVar4 + iVar7,val);
          iVar7 = iVar3 + iVar7;
        }
        pxVar2 = ctxt->input;
        if (*pxVar2->cur == '\n') {
          pxVar2->line = pxVar2->line + 1;
          pxVar2->col = 1;
        }
        else {
          pxVar2->col = pxVar2->col + 1;
        }
        pxVar6 = pxVar2->cur + local_54;
        pxVar2->cur = pxVar6;
        if ((ctxt->progressive == 0) && ((long)pxVar2->end - (long)pxVar6 < 0xfa)) {
          xmlGROW(ctxt);
        }
        val = xmlCurrentChar(ctxt,&local_54);
        str = pbVar4;
      } while (val != 0);
      if ((ctxt->progressive == 0) && ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
        xmlGROW(ctxt);
      }
    } while( true );
  }
LAB_0015ce36:
  if (str != (byte *)0x0) {
    (*xmlFree)(str);
  }
  return pxVar6;
LAB_0015cd98:
  bVar1 = *local_50;
  uVar8 = (uint)bVar1;
  if (bVar1 == 0x25) {
LAB_0015cdb9:
    local_50 = local_50 + 1;
    pxVar6 = xmlParseStringName(ctxt,&local_50);
    if ((pxVar6 == (xmlChar *)0x0) || ((*xmlFree)(pxVar6), *local_50 != 0x3b)) {
      xmlFatalErrMsgInt(ctxt,XML_ERR_ENTITY_CHAR_ERROR,
                        "EntityValue: \'%c\' forbidden except for entities references\n",uVar8);
LAB_0015ce33:
      pxVar6 = (xmlChar *)0x0;
      goto LAB_0015ce36;
    }
    if (((uVar8 == 0x25) && (ctxt->inSubset == 1)) && (ctxt->inputNr == 1)) {
      error = XML_ERR_ENTITY_PE_INTERNAL;
LAB_0015ce0f:
      pxVar6 = (xmlChar *)0x0;
      xmlFatalErr(ctxt,error,(char *)0x0);
      goto LAB_0015ce36;
    }
  }
  else if (bVar1 == 0x26) {
    if (local_50[1] != 0x23) goto LAB_0015cdb9;
  }
  else if (uVar8 == 0) goto LAB_0015ce59;
  local_50 = local_50 + 1;
  goto LAB_0015cd98;
LAB_0015ce59:
  ctxt->depth = ctxt->depth + 1;
  pxVar6 = xmlStringDecodeEntities(ctxt,str,2,'\0','\0','\0');
  ctxt->depth = ctxt->depth + -1;
  if (local_38 != (xmlChar **)0x0) {
    *local_38 = str;
    str = (byte *)0x0;
  }
  goto LAB_0015ce36;
}

Assistant:

xmlChar *
xmlParseEntityValue(xmlParserCtxtPtr ctxt, xmlChar **orig) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int c, l;
    xmlChar stop;
    xmlChar *ret = NULL;
    const xmlChar *cur = NULL;
    xmlParserInputPtr input;

    if (RAW == '"') stop = '"';
    else if (RAW == '\'') stop = '\'';
    else {
	xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_STARTED, NULL);
	return(NULL);
    }
    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
    if (buf == NULL) {
	xmlErrMemory(ctxt, NULL);
	return(NULL);
    }

    /*
     * The content of the entity definition is copied in a buffer.
     */

    ctxt->instate = XML_PARSER_ENTITY_VALUE;
    input = ctxt->input;
    GROW;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    NEXT;
    c = CUR_CHAR(l);
    /*
     * NOTE: 4.4.5 Included in Literal
     * When a parameter entity reference appears in a literal entity
     * value, ... a single or double quote character in the replacement
     * text is always treated as a normal data character and will not
     * terminate the literal.
     * In practice it means we stop the loop only when back at parsing
     * the initial entity and the quote is found
     */
    while (((IS_CHAR(c)) && ((c != stop) || /* checked */
	    (ctxt->input != input))) && (ctxt->instate != XML_PARSER_EOF)) {
	if (len + 5 >= size) {
	    xmlChar *tmp;

	    size *= 2;
	    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
	    if (tmp == NULL) {
		xmlErrMemory(ctxt, NULL);
                goto error;
	    }
	    buf = tmp;
	}
	COPY_BUF(l,buf,len,c);
	NEXTL(l);

	GROW;
	c = CUR_CHAR(l);
	if (c == 0) {
	    GROW;
	    c = CUR_CHAR(l);
	}
    }
    buf[len] = 0;
    if (ctxt->instate == XML_PARSER_EOF)
        goto error;
    if (c != stop) {
        xmlFatalErr(ctxt, XML_ERR_ENTITY_NOT_FINISHED, NULL);
        goto error;
    }
    NEXT;

    /*
     * Raise problem w.r.t. '&' and '%' being used in non-entities
     * reference constructs. Note Charref will be handled in
     * xmlStringDecodeEntities()
     */
    cur = buf;
    while (*cur != 0) { /* non input consuming */
	if ((*cur == '%') || ((*cur == '&') && (cur[1] != '#'))) {
	    xmlChar *name;
	    xmlChar tmp = *cur;
            int nameOk = 0;

	    cur++;
	    name = xmlParseStringName(ctxt, &cur);
            if (name != NULL) {
                nameOk = 1;
                xmlFree(name);
            }
            if ((nameOk == 0) || (*cur != ';')) {
		xmlFatalErrMsgInt(ctxt, XML_ERR_ENTITY_CHAR_ERROR,
	    "EntityValue: '%c' forbidden except for entities references\n",
	                          tmp);
                goto error;
	    }
	    if ((tmp == '%') && (ctxt->inSubset == 1) &&
		(ctxt->inputNr == 1)) {
		xmlFatalErr(ctxt, XML_ERR_ENTITY_PE_INTERNAL, NULL);
                goto error;
	    }
	    if (*cur == 0)
	        break;
	}
	cur++;
    }

    /*
     * Then PEReference entities are substituted.
     *
     * NOTE: 4.4.7 Bypassed
     * When a general entity reference appears in the EntityValue in
     * an entity declaration, it is bypassed and left as is.
     * so XML_SUBSTITUTE_REF is not set here.
     */
    ++ctxt->depth;
    ret = xmlStringDecodeEntities(ctxt, buf, XML_SUBSTITUTE_PEREF,
                                  0, 0, 0);
    --ctxt->depth;
    if (orig != NULL) {
        *orig = buf;
        buf = NULL;
    }

error:
    if (buf != NULL)
        xmlFree(buf);
    return(ret);
}